

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::Evaluate
          (WindowDistinctAggregatorLocalState *this,WindowDistinctAggregatorGlobalState *gdstate,
          DataChunk *bounds,Vector *result,idx_t count,idx_t row_idx)

{
  SubFrames *in_RSI;
  WindowAggregateStates *in_RDI;
  idx_t unaff_retaddr;
  WindowExcludeMode in_stack_0000000f;
  DataChunk *in_stack_00000010;
  anon_class_48_6_b8ed951a in_stack_00000020;
  WindowExcludeMode exclude_mode;
  WindowAggregateStates *levels_flat_native;
  WindowDistinctSortTree *merge_sort_tree;
  uchar **pdata;
  uchar **ldata;
  idx_t in_stack_ffffffffffffff58;
  WindowAggregateStates *in_stack_ffffffffffffff60;
  WindowDistinctAggregatorLocalState *this_00;
  WindowAggregateStates *result_00;
  WindowAggregateStates *this_01;
  _func_int **local_38;
  WindowAggregateStates *row_idx_00;
  
  row_idx_00 = in_RDI;
  local_38 = (_func_int **)FlatVector::GetData<unsigned_char_const*>((Vector *)0x1a3c180);
  FlatVector::GetData<unsigned_char*>((Vector *)0x1a3c199);
  this_01 = (WindowAggregateStates *)
            &in_RSI[0x23].super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  WindowAggregateStates::Initialize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_00 = (WindowDistinctAggregatorLocalState *)&stack0xffffffffffffffc8;
  result_00 = in_RDI;
  WindowAggregator::
  EvaluateSubFrames<duckdb::WindowDistinctAggregatorLocalState::Evaluate(duckdb::WindowDistinctAggregatorGlobalState_const&,duckdb::DataChunk_const&,duckdb::Vector&,unsigned_long,unsigned_long)::__0>
            (in_stack_00000010,in_stack_0000000f,unaff_retaddr,(idx_t)row_idx_00,in_RSI,
             in_stack_00000020);
  FlushStates(this_00);
  WindowAggregateStates::Finalize(this_01,(Vector *)result_00);
  WindowAggregateStates::Destroy(in_RDI);
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::Evaluate(const WindowDistinctAggregatorGlobalState &gdstate,
                                                  const DataChunk &bounds, Vector &result, idx_t count, idx_t row_idx) {
	auto ldata = FlatVector::GetData<const_data_ptr_t>(statel);
	auto pdata = FlatVector::GetData<data_ptr_t>(statep);

	const auto &merge_sort_tree = gdstate.merge_sort_tree;
	const auto &levels_flat_native = gdstate.levels_flat_native;
	const auto exclude_mode = gdstate.aggregator.exclude_mode;

	//	Build the finalise vector that just points to the result states
	statef.Initialize(count);

	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t rid) {
		auto agg_state = statef.GetStatePtr(rid);

		//	TODO: Extend AggregateLowerBound to handle subframes, just like SelectNth.
		const auto lower = frames[0].start;
		const auto upper = frames[0].end;
		merge_sort_tree.AggregateLowerBound(lower, upper, lower + 1,
		                                    [&](idx_t level, const idx_t run_begin, const idx_t run_pos) {
			                                    if (run_pos != run_begin) {
				                                    //	Find the source aggregate
				                                    // Buffer a merge of the indicated state into the current state
				                                    const auto agg_idx = gdstate.levels_flat_start[level] + run_pos - 1;
				                                    const auto running_agg = levels_flat_native.GetStatePtr(agg_idx);
				                                    pdata[flush_count] = agg_state;
				                                    ldata[flush_count++] = running_agg;
				                                    if (flush_count >= STANDARD_VECTOR_SIZE) {
					                                    FlushStates();
				                                    }
			                                    }
		                                    });
	});

	//	Flush the final states
	FlushStates();

	//	Finalise the result aggregates and write to the result
	statef.Finalize(result);

	//	Destruct any non-POD state
	statef.Destroy();
}